

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

package * lsvm::object::new_package(symbol *name)

{
  package *ppVar1;
  symbolmap *psVar2;
  symbol *in_RDI;
  package *pkg;
  package **parent;
  size_t in_stack_ffffffffffffffe8;
  long *local_10;
  
  local_10 = &packages;
  if (packages != 0) {
    do {
      local_10 = (long *)(*local_10 + 0x10);
    } while (*local_10 != 0);
  }
  ppVar1 = (package *)memory::allocate(in_stack_ffffffffffffffe8);
  ppVar1->name = in_RDI;
  psVar2 = symbol::new_symbolmap();
  ppVar1->classes = psVar2;
  *local_10 = (long)ppVar1;
  return ppVar1;
}

Assistant:

package* new_package(symbol* name){

    package** parent = &packages;
    if(*parent != null){
        do{
            parent = &((*parent)->next);
        }while(*parent != null);
    }

    package* pkg = (package*)lsvm::memory::allocate(sizeof(package));
    pkg->name = name;
    pkg->classes = lsvm::symbol::new_symbolmap();
    *parent = pkg;
    return pkg;    
}